

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::UninterpretedOption::MergePartialFromCodedStream
          (UninterpretedOption *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  uint8 *puVar3;
  void **ppvVar4;
  bool bVar5;
  uint uVar6;
  Limit limit;
  UninterpretedOption_NamePart *this_00;
  double *pdVar7;
  string *psVar8;
  double *pdVar9;
  long lVar10;
  uint32 tag;
  int iVar11;
  double dVar12;
  undefined8 local_50;
  uint64 *local_48;
  RepeatedPtrFieldBase *local_40;
  UnknownFieldSet *local_38;
  
  local_40 = &(this->name_).super_RepeatedPtrFieldBase;
  local_48 = &this->positive_int_value_;
  local_38 = &this->_unknown_fields_;
LAB_001f2558:
  do {
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar3 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar6 = tag & 7;
    switch(tag >> 3) {
    case 2:
      if (uVar6 == 2) {
        while( true ) {
          iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
          iVar11 = (this->name_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar2 < iVar11) {
            ppvVar4 = (this->name_).super_RepeatedPtrFieldBase.elements_;
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            this_00 = (UninterpretedOption_NamePart *)ppvVar4[iVar2];
          }
          else {
            if (iVar11 == (this->name_).super_RepeatedPtrFieldBase.total_size_) {
              internal::RepeatedPtrFieldBase::Reserve(local_40,iVar11 + 1);
              iVar11 = (this->name_).super_RepeatedPtrFieldBase.allocated_size_;
            }
            (this->name_).super_RepeatedPtrFieldBase.allocated_size_ = iVar11 + 1;
            this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>::
                      New();
            ppvVar4 = (this->name_).super_RepeatedPtrFieldBase.elements_;
            iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            ppvVar4[iVar2] = this_00;
          }
          puVar3 = input->buffer_;
          if ((puVar3 < input->buffer_end_) && (uVar1 = *puVar3, -1 < (char)uVar1)) {
            input->buffer_ = puVar3 + 1;
            local_50._0_4_ = (int)(char)uVar1;
          }
          else {
            bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_50);
            if (!bVar5) {
              return false;
            }
          }
          iVar2 = input->recursion_depth_;
          input->recursion_depth_ = iVar2 + 1;
          if (input->recursion_limit_ <= iVar2) {
            return false;
          }
          limit = io::CodedInputStream::PushLimit(input,(uint32)local_50);
          bVar5 = UninterpretedOption_NamePart::MergePartialFromCodedStream(this_00,input);
          if (!bVar5) {
            return false;
          }
          if (input->legitimate_message_end_ != true) {
            return false;
          }
          io::CodedInputStream::PopLimit(input,limit);
          if (0 < input->recursion_depth_) {
            input->recursion_depth_ = input->recursion_depth_ + -1;
          }
          puVar3 = input->buffer_;
          if (input->buffer_end_ <= puVar3) goto LAB_001f2558;
          if (*puVar3 != '\x12') break;
          input->buffer_ = puVar3 + 1;
        }
        if (*puVar3 == '\x1a') {
          input->buffer_ = puVar3 + 1;
LAB_001f270d:
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          psVar8 = this->identifier_value_;
          if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
            psVar8 = (string *)operator_new(0x20);
            (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
            psVar8->_M_string_length = 0;
            (psVar8->field_2)._M_local_buf[0] = '\0';
            this->identifier_value_ = psVar8;
          }
          bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
          if (!bVar5) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->identifier_value_->_M_dataplus)._M_p,
                     (int)this->identifier_value_->_M_string_length,PARSE);
          pdVar7 = (double *)input->buffer_;
          pdVar9 = (double *)input->buffer_end_;
          if ((pdVar7 < pdVar9) && (*(uint8 *)pdVar7 == ' ')) {
            pdVar7 = (double *)((long)pdVar7 + 1);
            input->buffer_ = (uint8 *)pdVar7;
LAB_001f2785:
            if ((pdVar7 < pdVar9) && (-1 < (long)(char)*(uint8 *)pdVar7)) {
              *local_48 = (long)(char)*(uint8 *)pdVar7;
              pdVar7 = (double *)((long)pdVar7 + 1);
              input->buffer_ = (uint8 *)pdVar7;
            }
            else {
              bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,local_48);
              if (!bVar5) {
                return false;
              }
              pdVar7 = (double *)input->buffer_;
              pdVar9 = (double *)input->buffer_end_;
            }
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
            if ((pdVar7 < pdVar9) && (*(uint8 *)pdVar7 == '(')) {
              pdVar7 = (double *)((long)pdVar7 + 1);
              input->buffer_ = (uint8 *)pdVar7;
LAB_001f2819:
              if ((pdVar7 < pdVar9) && (lVar10 = (long)(char)*(uint8 *)pdVar7, -1 < lVar10)) {
                pdVar7 = (double *)((long)pdVar7 + 1);
                input->buffer_ = (uint8 *)pdVar7;
              }
              else {
                bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,&local_50);
                if (!bVar5) {
                  return false;
                }
                lVar10 = CONCAT44(local_50._4_4_,(uint32)local_50);
                pdVar7 = (double *)input->buffer_;
                pdVar9 = (double *)input->buffer_end_;
              }
              this->negative_int_value_ = lVar10;
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
              if ((pdVar7 < pdVar9) && (*(uint8 *)pdVar7 == '1')) {
                pdVar7 = (double *)((long)pdVar7 + 1);
                input->buffer_ = (uint8 *)pdVar7;
LAB_001f2874:
                if ((int)pdVar9 - (int)pdVar7 < 8) {
                  bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,&local_50);
                  if (!bVar5) {
                    return false;
                  }
                  dVar12 = (double)CONCAT44(local_50._4_4_,(uint32)local_50);
                  pdVar7 = (double *)input->buffer_;
                  pdVar9 = (double *)input->buffer_end_;
                }
                else {
                  dVar12 = *pdVar7;
                  pdVar7 = pdVar7 + 1;
                  input->buffer_ = (uint8 *)pdVar7;
                }
                this->double_value_ = dVar12;
                uVar6 = this->_has_bits_[0] | 0x10;
                this->_has_bits_[0] = uVar6;
                if ((pdVar7 < pdVar9) && (*(uint8 *)pdVar7 == ':')) {
                  input->buffer_ = (uint8 *)((long)pdVar7 + 1);
LAB_001f28b7:
                  this->_has_bits_[0] = uVar6 | 0x20;
                  psVar8 = this->string_value_;
                  if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
                    psVar8 = (string *)operator_new(0x20);
                    (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
                    psVar8->_M_string_length = 0;
                    (psVar8->field_2)._M_local_buf[0] = '\0';
                    this->string_value_ = psVar8;
                  }
                  bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
                  if (!bVar5) {
                    return false;
                  }
                  puVar3 = input->buffer_;
                  if ((puVar3 < input->buffer_end_) && (*puVar3 == 'B')) {
                    input->buffer_ = puVar3 + 1;
LAB_001f291d:
                    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
                    psVar8 = this->aggregate_value_;
                    if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
                      psVar8 = (string *)operator_new(0x20);
                      (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
                      psVar8->_M_string_length = 0;
                      (psVar8->field_2)._M_local_buf[0] = '\0';
                      this->aggregate_value_ = psVar8;
                    }
                    bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
                    if (!bVar5) {
                      return false;
                    }
                    internal::WireFormat::VerifyUTF8StringFallback
                              ((this->aggregate_value_->_M_dataplus)._M_p,
                               (int)this->aggregate_value_->_M_string_length,PARSE);
                    if ((input->buffer_ == input->buffer_end_) &&
                       ((input->buffer_size_after_limit_ != 0 ||
                        (input->total_bytes_read_ == input->current_limit_)))) {
                      input->last_tag_ = 0;
                      input->legitimate_message_end_ = true;
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001f2558;
      }
      break;
    case 3:
      if (uVar6 == 2) goto LAB_001f270d;
      break;
    case 4:
      if (uVar6 == 0) {
        pdVar7 = (double *)input->buffer_;
        pdVar9 = (double *)input->buffer_end_;
        goto LAB_001f2785;
      }
      break;
    case 5:
      if (uVar6 == 0) {
        pdVar7 = (double *)input->buffer_;
        pdVar9 = (double *)input->buffer_end_;
        goto LAB_001f2819;
      }
      break;
    case 6:
      if (uVar6 == 1) {
        pdVar7 = (double *)input->buffer_;
        pdVar9 = (double *)input->buffer_end_;
        goto LAB_001f2874;
      }
      break;
    case 7:
      if (uVar6 == 2) {
        uVar6 = this->_has_bits_[0];
        goto LAB_001f28b7;
      }
      break;
    case 8:
      if (uVar6 == 2) goto LAB_001f291d;
    }
    if (uVar6 == 4) {
      return true;
    }
    bVar5 = internal::WireFormat::SkipField(input,tag,local_38);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_name()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_name;
        if (input->ExpectTag(26)) goto parse_identifier_value;
        break;
      }

      // optional string identifier_value = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_identifier_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_identifier_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->identifier_value().data(), this->identifier_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_positive_int_value;
        break;
      }

      // optional uint64 positive_int_value = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_positive_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &positive_int_value_)));
          set_has_positive_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_negative_int_value;
        break;
      }

      // optional int64 negative_int_value = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_negative_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &negative_int_value_)));
          set_has_negative_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(49)) goto parse_double_value;
        break;
      }

      // optional double double_value = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_FIXED64) {
         parse_double_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &double_value_)));
          set_has_double_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_string_value;
        break;
      }

      // optional bytes string_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_string_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_string_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_aggregate_value;
        break;
      }

      // optional string aggregate_value = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_aggregate_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_aggregate_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->aggregate_value().data(), this->aggregate_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}